

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

bool __thiscall
libtorrent::peer_list::insert_peer
          (peer_list *this,torrent_peer *p,iterator *iter,pex_flags_t flags,torrent_state *state)

{
  int iVar1;
  uint uVar2;
  _Map_pointer ppptVar3;
  _Elt_pointer pptVar4;
  _Elt_pointer pptVar5;
  torrent_peer *local_e0;
  string_view local_d8 [2];
  iterator local_b8;
  _Elt_pointer local_98;
  _Elt_pointer pptStack_90;
  _Elt_pointer local_88;
  _Map_pointer ppptStack_80;
  _Elt_pointer local_78;
  _Elt_pointer local_70;
  _Elt_pointer local_68;
  _Map_pointer local_60;
  const_iterator local_58;
  
  iVar1 = state->max_peerlist_size;
  local_e0 = p;
  if ((iVar1 != 0) &&
     (ppptVar3 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,
     iVar1 <= (int)((int)((ulong)((long)(this->m_peers).
                                        super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                        .
                                        super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                                 (long)(this->m_peers).
                                       super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                       .
                                       super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
                    (int)((ulong)((long)(this->m_peers).
                                        super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                        .
                                        super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(this->m_peers).
                                       super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                       .
                                       super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
                   ((((uint)((int)ppptVar3 -
                            *(int *)&(this->m_peers).
                                     super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                     .
                                     super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (uint)(ppptVar3 == (_Map_pointer)0x0)) * 0x40))) {
    if ((*(uint *)&p->field_0x1b & 0x3f0000) == 0x100000) {
      return false;
    }
    erase_peers(this,state,(erase_peer_flags_t)0x0);
    local_60 = (this->m_peers).
               super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
               super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_b8._M_node =
         (this->m_peers).
         super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_node;
    local_78 = (this->m_peers).
               super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
               super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_70 = (this->m_peers).
               super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
               super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_b8._M_cur =
         (this->m_peers).
         super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_b8._M_last =
         (this->m_peers).
         super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_last;
    if (iVar1 <= (int)((int)((ulong)((long)local_b8._M_last - (long)local_b8._M_cur) >> 3) +
                       (int)((ulong)((long)local_78 - (long)local_70) >> 3) +
                      ((((uint)((int)local_60 - (int)local_b8._M_node) >> 3) - 1) +
                      (uint)(local_60 == (_Map_pointer)0x0)) * 0x40)) {
      return false;
    }
    if ((p->field_0x1e & 1) == 0) {
      pptVar4 = (this->m_peers).
                super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
      pptVar5 = (this->m_peers).
                super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last;
      torrent_peer::address(p);
      local_b8._M_first = pptVar4;
      local_68 = pptVar5;
      std::
      __lower_bound<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,boost::asio::ip::address,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::peer_address_compare>>
                (&local_98,&local_b8,&local_78,local_d8);
    }
    else {
      pptVar4 = (this->m_peers).
                super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
      pptVar5 = (this->m_peers).
                super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_d8[0] = torrent_peer::dest(p);
      local_b8._M_first = pptVar4;
      local_68 = pptVar5;
      std::
      __lower_bound<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,boost::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::peer_address_compare>>
                (&local_98);
    }
    iter->_M_last = local_88;
    iter->_M_node = ppptStack_80;
    iter->_M_cur = local_98;
    iter->_M_first = pptStack_90;
  }
  local_58._M_cur = iter->_M_cur;
  local_58._M_first = iter->_M_first;
  local_58._M_last = iter->_M_last;
  local_58._M_node = iter->_M_node;
  std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::insert
            (&local_b8,
             (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)this,
             &local_58,&local_e0);
  iter->_M_last = local_b8._M_last;
  iter->_M_node = local_b8._M_node;
  iter->_M_cur = local_b8._M_cur;
  iter->_M_first = local_b8._M_first;
  if ((long)(((long)(this->m_peers).
                    super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(this->m_peers).
                    super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)iter->_M_cur - (long)iter->_M_first >> 3) +
            ((((ulong)((long)iter->_M_node -
                      (long)(this->m_peers).
                            super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                            .
                            super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(iter->_M_node == (_Map_pointer)0x0)) * 0x40) <= (long)this->m_round_robin) {
    this->m_round_robin = this->m_round_robin + 1;
  }
  if ((flags.m_val & 2) != 0) {
    local_e0->field_0x1d = local_e0->field_0x1d | 0x40;
  }
  if ((flags.m_val & 4) != 0) {
    local_e0->field_0x1b = local_e0->field_0x1b | 0x80;
    *(uint *)&this->field_0x60 =
         *(uint *)&this->field_0x60 & 0x80000000 | *(uint *)&this->field_0x60 + 1 & 0x7fffffff;
  }
  if ((flags.m_val & 8) != 0) {
    local_e0->field_0x1e = local_e0->field_0x1e | 8;
  }
  if ((flags.m_val & 0x10) != 0) {
    local_e0->field_0x1e = local_e0->field_0x1e | 0x20;
  }
  if ((((local_e0->connection == (peer_connection_interface *)0x0) &&
       (uVar2 = *(uint *)&local_e0->field_0x1b, (uVar2 & 0x44000020) == 0x20)) &&
      ((-1 < (char)uVar2 || (-1 < *(int *)&this->field_0x60)))) &&
     ((int)(uVar2 & 0x1f) < this->m_max_failcount)) {
    this->m_num_connect_candidates = this->m_num_connect_candidates + 1;
  }
  return true;
}

Assistant:

bool peer_list::insert_peer(torrent_peer* p, iterator iter
		, pex_flags_t const flags
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(p);
		TORRENT_ASSERT(p->in_use);

		int const max_peerlist_size = state->max_peerlist_size;

		if (max_peerlist_size
			&& int(m_peers.size()) >= max_peerlist_size)
		{
			if (p->peer_source() == peer_info::resume_data) return false;

			erase_peers(state);
			if (int(m_peers.size()) >= max_peerlist_size)
				return false;

			// since some peers were removed, we need to
			// update the iterator to make it valid again
#if TORRENT_USE_I2P
			if (p->is_i2p_addr)
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, p->dest(), peer_address_compare());
			}
			else
#endif
			iter = std::lower_bound(
				m_peers.begin(), m_peers.end()
				, p->address(), peer_address_compare());
		}

		iter = m_peers.insert(iter, p);

		if (m_round_robin >= iter - m_peers.begin()) ++m_round_robin;

#if !defined TORRENT_DISABLE_ENCRYPTION
		if (flags & pex_encryption) p->pe_support = true;
#endif
		if (flags & pex_seed)
		{
			p->seed = true;
			TORRENT_ASSERT(m_num_seeds < int(m_peers.size()));
			++m_num_seeds;
		}
		if (flags & pex_utp)
			p->supports_utp = true;
		if (flags & pex_holepunch)
			p->supports_holepunch = true;
		if (is_connect_candidate(*p))
			update_connect_candidates(1);

		return true;
	}